

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bin_io_text_read.cpp
# Opt level: O3

bool __thiscall ritobin::io::impl_text_read::TextReader::read_hash(TextReader *this,XXH64 *value)

{
  bool bVar1;
  char *pcVar2;
  char *__last;
  bool bVar3;
  bool bVar4;
  string_view sVar5;
  __integer_from_chars_result_type<unsigned_long> _Var6;
  uint64_t result;
  unsigned_long local_20;
  
  sVar5 = read_word(this);
  pcVar2 = sVar5._M_str;
  if (((sVar5._M_len < 2) || (*pcVar2 != '0')) || ((byte)(pcVar2[1] | 0x20U) != 0x78)) {
    bVar1 = false;
  }
  else {
    local_20 = 0;
    __last = pcVar2 + sVar5._M_len;
    _Var6 = std::from_chars<unsigned_long>(pcVar2 + 2,__last,&local_20,0x10);
    bVar3 = _Var6.ec == 0;
    bVar4 = _Var6.ptr == __last;
    bVar1 = bVar4 && bVar3;
    if (bVar4 && bVar3) {
      read_hash();
    }
  }
  return bVar1;
}

Assistant:

bool read_hash(XXH64& value) noexcept {
            auto const word = read_word();
            if (word.size() < 2) {
                return false;
            }
            if (word[0] != '0' || (word[1] != 'x' && word[1] != 'X')) {
                return false;
            }
            uint64_t result = 0;
            if (to_num({word.data() + 2, word.size() - 2}, result, 16)) {
                value = XXH64{ result };
                return true;
            }
            return false;
        }